

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_game.cpp
# Opt level: O2

void __thiscall cpp_client::Base_game::set_ai_parameters(Base_game *this,string *params)

{
  Base_ai *pBVar1;
  _Alloc_hider _Var2;
  long lVar3;
  long lVar4;
  mapped_type *pmVar5;
  Input_error *pIVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> to_parse;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*(this->super_Delta_mergable)._vptr_Delta_mergable[0xb])(&to_parse,this);
  _Var2 = to_parse._M_dataplus;
  to_parse._M_dataplus._M_p = (pointer)0x0;
  pBVar1 = (this->ai_)._M_t.
           super___uniq_ptr_impl<cpp_client::Base_ai,_std::default_delete<cpp_client::Base_ai>_>.
           _M_t.
           super__Tuple_impl<0UL,_cpp_client::Base_ai_*,_std::default_delete<cpp_client::Base_ai>_>.
           super__Head_base<0UL,_cpp_client::Base_ai_*,_false>._M_head_impl;
  (this->ai_)._M_t.
  super___uniq_ptr_impl<cpp_client::Base_ai,_std::default_delete<cpp_client::Base_ai>_>._M_t.
  super__Tuple_impl<0UL,_cpp_client::Base_ai_*,_std::default_delete<cpp_client::Base_ai>_>.
  super__Head_base<0UL,_cpp_client::Base_ai_*,_false>._M_head_impl = (Base_ai *)_Var2._M_p;
  if (pBVar1 != (Base_ai *)0x0) {
    (*pBVar1->_vptr_Base_ai[7])();
    if (to_parse._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)to_parse._M_dataplus._M_p + 0x38))();
    }
  }
  if (params->_M_string_length != 0) {
    if (*(params->_M_dataplus)._M_p == '&') {
      pIVar6 = (Input_error *)__cxa_allocate_exception(0x10);
      std::operator+(&to_parse,"Can not begin AI settings string with &, string was:\n",params);
      Input_error::runtime_error(pIVar6,&to_parse);
      __cxa_throw(pIVar6,&Input_error::typeinfo,std::runtime_error::~runtime_error);
    }
    do {
      lVar3 = std::__cxx11::string::find((char)params,0x26);
      std::__cxx11::string::substr((ulong)&to_parse,(ulong)params);
      lVar4 = std::__cxx11::string::find((char)&to_parse,0x3d);
      if (lVar4 == -1) {
        pIVar6 = (Input_error *)__cxa_allocate_exception(0x10);
        std::operator+(&local_70,"Could not parse the AI settings string:\n",params);
        std::operator+(&local_50,&local_70,"\nIn particular, could not find \'=\' in \"");
        std::operator+(&value,&local_50,&to_parse);
        std::operator+(&key,&value,"\"");
        Input_error::runtime_error(pIVar6,&key);
        __cxa_throw(pIVar6,&Input_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::substr((ulong)&key,(ulong)&to_parse);
      std::__cxx11::string::substr((ulong)&value,(ulong)&to_parse);
      pmVar5 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&((this->ai_)._M_t.
                                 super___uniq_ptr_impl<cpp_client::Base_ai,_std::default_delete<cpp_client::Base_ai>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cpp_client::Base_ai_*,_std::default_delete<cpp_client::Base_ai>_>
                                 .super__Head_base<0UL,_cpp_client::Base_ai_*,_false>._M_head_impl)
                                ->passed_params_,&key);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      std::__cxx11::string::~string((string *)&value);
      std::__cxx11::string::~string((string *)&key);
      std::__cxx11::string::~string((string *)&to_parse);
    } while (lVar3 != -1);
  }
  return;
}

Assistant:

void Base_game::set_ai_parameters(const std::string& params)
{
   ai_ = generate_ai();
   // this simplifies code a lot
   if(params.empty())
   {
      return;
   }
   // error on leading ampersands
   if(params[0] == '&')
   {
      throw Input_error("Can not begin AI settings string with &, string was:\n" +
                        params);
   }
   auto split = 0;
   while(true)
   {
      const auto new_split = params.find('&', split + 1);
      const auto to_parse = params.substr(split, new_split - split);
      const auto eq_loc = to_parse.find('=');
      if(eq_loc == params.npos)
      {
         throw Input_error("Could not parse the AI settings string:\n" +
                           params + "\n"
                           "In particular, could not find '=' in \"" + to_parse + "\"");
      }
      const auto key = to_parse.substr(0, eq_loc);
      const auto value = to_parse.substr(eq_loc + 1, std::string::npos);
      ai_->passed_params_[key] = value;
      if(new_split == std::string::npos)
      {
         break;
      }
      split = new_split + 1;
   }
}